

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

literal * __thiscall json::literal::dump_abi_cxx11_(literal *this)

{
  long in_RSI;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19 [9];
  literal *this_local;
  
  this_local = this;
  if (*(int *)(in_RSI + 8) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"null",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else if (*(int *)(in_RSI + 8) == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"false",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"true",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  return this;
}

Assistant:

std::string json::literal::dump () const
{
       if (_lvalue == nullvalue)  return "null";
  else if (_lvalue == falsevalue) return "false";
  else                            return "true";
}